

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

char * stripctrl_string_ptrlen(StripCtrlChars *sccpub,ptrlen str)

{
  strbuf *buf_o;
  char *pcVar1;
  strbuf *out;
  StripCtrlChars *sccpub_local;
  ptrlen str_local;
  
  buf_o = strbuf_new();
  stripctrl_retarget(sccpub,buf_o->binarysink_);
  BinarySink_put_datapl(sccpub->binarysink_,str);
  stripctrl_retarget(sccpub,(BinarySink *)0x0);
  pcVar1 = strbuf_to_str(buf_o);
  return pcVar1;
}

Assistant:

char *stripctrl_string_ptrlen(StripCtrlChars *sccpub, ptrlen str)
{
    strbuf *out = strbuf_new();
    stripctrl_retarget(sccpub, BinarySink_UPCAST(out));
    put_datapl(sccpub, str);
    stripctrl_retarget(sccpub, NULL);
    return strbuf_to_str(out);
}